

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

int __thiscall
ApprovalTests::Options::clone
          (Options *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  FileOptions *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_ffffffffffffff58;
  shared_ptr<ApprovalTests::ApprovalNamer> *namer;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_ffffffffffffff60;
  undefined1 usingDefaultScrubber;
  int iVar1;
  Options *scrubber;
  Options *in_stack_ffffffffffffff80;
  
  scrubber = this;
  FileOptions::FileOptions
            ((FileOptions *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             in_stack_ffffffffffffff48);
  ::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  namer = *(shared_ptr<ApprovalTests::ApprovalNamer> **)
           ((long)&(((FileOptions *)((long)__fn + 0x28))->fileExtensionWithDot_).field_2 + 8);
  usingDefaultScrubber = (undefined1)((ulong)&stack0xffffffffffffff80 >> 0x38);
  ::std::shared_ptr<ApprovalTests::ApprovalNamer>::shared_ptr
            ((shared_ptr<ApprovalTests::ApprovalNamer> *)
             (ulong)CONCAT14((char)(((FileOptions *)((long)__fn + 0x50))->fileExtensionWithDot_).
                                   _M_string_length,in_stack_ffffffffffffff50),
             (shared_ptr<ApprovalTests::ApprovalNamer> *)in_stack_ffffffffffffff48);
  Options(in_stack_ffffffffffffff80,(FileOptions *)__fn,(Scrubber *)scrubber,(Reporter *)this,
          (bool)usingDefaultScrubber,namer);
  iVar1 = (int)scrubber;
  ::std::shared_ptr<ApprovalTests::ApprovalNamer>::~shared_ptr
            ((shared_ptr<ApprovalTests::ApprovalNamer> *)0x1d8a6f);
  ::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x1d8a79);
  FileOptions::~FileOptions((FileOptions *)0x1d8a83);
  return iVar1;
}

Assistant:

Options Options::clone(const Options::FileOptions& fileOptions) const
    {
        // TODO error this can retain a previous Options* ???
        return Options(fileOptions, scrubber_, reporter_, usingDefaultScrubber_, namer_);
    }